

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st2013.hpp
# Opt level: O3

void bcl::st2013::
     generate_transition_matrix<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
               (vector<double,_std::allocator<double>_> *weights,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *tm)

{
  pointer pdVar1;
  pointer pdVar2;
  double *pdVar3;
  double *pdVar4;
  pointer pvVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  double *pdVar9;
  double *pdVar10;
  long lVar11;
  ulong uVar12;
  pointer pvVar13;
  long lVar14;
  pointer pvVar15;
  size_t j;
  ulong uVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  vector<double,_std::allocator<double>_> accum;
  allocator_type local_49;
  value_type local_48;
  vector<double,_std::allocator<double>_> local_40;
  
  pdVar1 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar17 = (long)pdVar2 - (long)pdVar1 >> 3;
  local_48 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector(&local_40,uVar17 + 1,&local_48,&local_49);
  pdVar3 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  dVar18 = 0.0;
  pdVar10 = pdVar3;
  pdVar9 = pdVar3;
  if (pdVar3 != pdVar4) {
    do {
      dVar18 = dVar18 + *pdVar9;
      pdVar9 = pdVar9 + 1;
    } while (pdVar9 != pdVar4);
    pdVar9 = pdVar3 + 1;
    if (pdVar9 != pdVar4) {
      dVar20 = *pdVar3;
      do {
        dVar19 = *pdVar9;
        pdVar7 = pdVar9;
        if (*pdVar9 <= dVar20) {
          dVar19 = dVar20;
          pdVar7 = pdVar10;
        }
        pdVar10 = pdVar7;
        dVar20 = dVar19;
        pdVar9 = pdVar9 + 1;
      } while (pdVar9 != pdVar4);
    }
  }
  dVar20 = *pdVar10;
  *local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
   _M_start = 0.0;
  if (pdVar2 != pdVar1) {
    lVar8 = uVar17 + (uVar17 == 0);
    dVar19 = 0.0;
    lVar11 = 0;
    do {
      dVar19 = dVar19 + pdVar3[lVar11] / dVar18;
      local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar11 + 1] = dVar19;
      lVar11 = lVar11 + 1;
    } while (lVar8 != lVar11);
    if (pdVar2 != pdVar1) {
      pvVar5 = (tm->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar11 = 0;
      do {
        lVar6 = *(long *)&pvVar5[lVar11].super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data;
        lVar14 = 0;
        do {
          auVar24._0_8_ =
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11 + 1] + dVar20 / dVar18;
          dVar19 = local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11] + dVar20 / dVar18;
          auVar23._8_8_ =
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar14 + 1] + 1.0;
          auVar23._0_8_ =
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar14 + 1];
          auVar24._8_8_ = auVar24._0_8_;
          auVar24 = minpd(auVar23,auVar24);
          auVar21._8_8_ =
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar14] + 1.0;
          auVar21._0_8_ =
               local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar14];
          auVar22._8_8_ = dVar19;
          auVar22._0_8_ = dVar19;
          auVar22 = maxpd(auVar21,auVar22);
          auVar25._0_8_ = auVar24._0_8_ - auVar22._0_8_;
          auVar25._8_8_ = auVar24._8_8_ - auVar22._8_8_;
          auVar22 = maxpd(ZEXT816(0),auVar25);
          *(double *)(lVar6 + lVar14 * 8) = auVar22._8_8_ + auVar22._0_8_;
          lVar14 = lVar14 + 1;
        } while (lVar8 != lVar14);
        lVar11 = lVar11 + 1;
      } while (lVar11 != uVar17 + (uVar17 == 0));
      if (pdVar2 != pdVar1) {
        pvVar5 = (tm->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar12 = 0;
        pvVar13 = pvVar5;
        do {
          lVar8 = *(long *)&pvVar5[uVar12].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl;
          pvVar15 = pvVar13;
          uVar16 = uVar12;
          do {
            lVar11 = *(long *)&(pvVar15->super__Vector_base<double,_std::allocator<double>_>).
                               _M_impl.super__Vector_impl_data;
            dVar20 = (*(double *)(lVar8 + uVar16 * 8) + *(double *)(lVar11 + uVar12 * 8)) * 0.5;
            *(double *)(lVar8 + uVar16 * 8) = dVar20 / (pdVar3[uVar12] / dVar18);
            *(double *)(lVar11 + uVar12 * 8) = dVar20 / (pdVar3[uVar16] / dVar18);
            uVar16 = uVar16 + 1;
            pvVar15 = pvVar15 + 1;
          } while (uVar16 < uVar17);
          uVar12 = uVar12 + 1;
          pvVar13 = pvVar13 + 1;
        } while (uVar12 != uVar17 + (uVar17 == 0));
      }
    }
  }
  operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
  return;
}

Assistant:

static void generate_transition_matrix(VEC const& weights, MAT& tm) {
    using std::abs;
    std::size_t n = weights.size();
    std::vector<double> accum(n+1, 0);
    double sum = std::accumulate(weights.begin(), weights.end(), 0.0);
    double shift = *(std::max_element(weights.begin(), weights.end())) / sum;
    accum[0] = 0;
    for (std::size_t i = 0; i < n; ++i) accum[i+1] = accum[i] + weights[i] / sum;

    for (std::size_t i = 0; i < n; ++i) {
      for (std::size_t j = 0; j < n; ++j) {
        tm[i][j] = (std::max(std::min(accum[i+1] + shift, accum[j+1]) -
                             std::max(accum[i] + shift, accum[j]), 0.0) +
                    std::max(std::min(accum[i+1] + shift, accum[j+1] + 1) -
                             std::max(accum[i] + shift, accum[j] + 1), 0.0));
      }
    }
    for (std::size_t i = 0; i < n; ++i) {
      for (std::size_t j = i; j < n; ++j) {
        double t = (tm[i][j] + tm[j][i]) / 2;
        tm[i][j] = t / (weights[i] / sum);
        tm[j][i] = t / (weights[j] / sum);
      }
    }
  }